

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O2

vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_> *
pstack::Procman::Process::procAddressSpace
          (vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
           *__return_storage_ptr__,string *fn)

{
  pointer pAVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uintmax_t uVar6;
  mapped_type *__v;
  size_type __pos;
  Exception *this;
  int *piVar7;
  char *pcVar8;
  char *extraout_RDX;
  size_t sVar9;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view sVar10;
  string_view strv;
  string_view strv_00;
  string_view strv_01;
  string_view strv_02;
  string_view strv_03;
  string_view strv_04;
  string_view sv;
  long local_430;
  ifstream input;
  byte abStack_410 [488];
  undefined1 auStack_228 [8];
  value_type c;
  undefined4 uStack_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined1 local_200 [376];
  char *local_88;
  _Rb_tree<pstack::Procman::AddressRange::Permission,pstack::Procman::AddressRange::Permission,std::_Identity<pstack::Procman::AddressRange::Permission>,std::less<pstack::Procman::AddressRange::Permission>,std::allocator<pstack::Procman::AddressRange::Permission>>
  *local_80;
  undefined1 local_78 [8];
  string buf;
  optional<pstack::Procman::AddressRange::VmFlag> flag;
  undefined1 local_48 [8];
  string_view remains;
  
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
  reserve(__return_storage_ptr__,0x2800);
  local_78 = (undefined1  [8])&buf._M_string_length;
  buf._M_dataplus._M_p = (pointer)0x0;
  buf._M_string_length._0_1_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,0x400);
  std::ifstream::ifstream(&local_430,(string *)fn,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if ((cVar2 == '\0') || (lVar5 = *(long *)(local_430 + -0x18), *(int *)(abStack_410 + lVar5) != 0))
  {
    this = (Exception *)__cxa_allocate_exception(0x1a0);
    memset((Exception *)auStack_228,0,0x1a0);
    Exception::Exception((Exception *)auStack_228);
    std::operator<<((ostream *)&c,"unable to open smaps file: ");
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    std::operator<<((ostream *)&c,pcVar8);
    Exception::Exception(this,(Exception *)auStack_228);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  while ((abStack_410[lVar5] & 5) == 0) {
    iVar4 = std::istream::peek();
    if (iVar4 == -1) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_430,(string *)local_78);
    local_48 = (undefined1  [8])buf._M_dataplus._M_p;
    remains._M_len = (size_t)local_78;
    std::vector<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>::
    emplace_back<>(__return_storage_ptr__);
    pAVar1 = (__return_storage_ptr__->
             super__Vector_base<pstack::Procman::AddressRange,_std::allocator<pstack::Procman::AddressRange>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    sVar10 = nextTok<char>((string_view *)local_48,'-');
    strv._M_str = sVar10._M_str;
    strv._M_len = (size_t)strv._M_str;
    uVar6 = hex2int((Procman *)sVar10._M_len,strv);
    pAVar1[-1].start = uVar6;
    sVar10 = nextTok<char>((string_view *)local_48,' ');
    strv_00._M_str = sVar10._M_str;
    strv_00._M_len = (size_t)strv_00._M_str;
    uVar6 = hex2int((Procman *)sVar10._M_len,strv_00);
    pAVar1[-1].end = uVar6;
    sVar10 = nextTok<char>((string_view *)local_48,' ');
    local_88 = sVar10._M_str;
    if (procAddressSpace(std::__cxx11::string_const&)::flagmap == '\0') {
      iVar4 = __cxa_guard_acquire(&procAddressSpace(std::__cxx11::string_const&)::flagmap);
      if (iVar4 != 0) {
        local_218 = 0x200000078;
        uStack_210 = 0x300000070;
        _c = 0x77;
        auStack_228 = (undefined1  [8])0x72;
        uStack_21c = 1;
        local_208 = 0x500000073;
        std::
        _Hashtable<char,std::pair<char_const,pstack::Procman::AddressRange::Permission>,std::allocator<std::pair<char_const,pstack::Procman::AddressRange::Permission>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_Hashtable<std::pair<char_const,pstack::Procman::AddressRange::Permission>const*>
                  ((_Hashtable<char,std::pair<char_const,pstack::Procman::AddressRange::Permission>,std::allocator<std::pair<char_const,pstack::Procman::AddressRange::Permission>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&procAddressSpace::flagmap,(string_view *)auStack_228,local_200,0,
                   (undefined1 *)((long)&buf.field_2 + 8),(undefined1 *)((long)&remains._M_str + 6),
                   (undefined1 *)((long)&remains._M_str + 7));
        __cxa_atexit(std::
                     unordered_map<char,_pstack::Procman::AddressRange::Permission,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>_>
                     ::~unordered_map,&procAddressSpace::flagmap,&__dso_handle);
        __cxa_guard_release(&procAddressSpace(std::__cxx11::string_const&)::flagmap);
      }
    }
    local_80 = (_Rb_tree<pstack::Procman::AddressRange::Permission,pstack::Procman::AddressRange::Permission,std::_Identity<pstack::Procman::AddressRange::Permission>,std::less<pstack::Procman::AddressRange::Permission>,std::allocator<pstack::Procman::AddressRange::Permission>>
                *)&pAVar1[-1].permissions;
    for (sVar9 = 0; sVar10._M_len != sVar9; sVar9 = sVar9 + 1) {
      auStack_228[0] = local_88[sVar9];
      if (local_88[sVar9] != '-') {
        __v = std::__detail::
              _Map_base<char,_std::pair<const_char,_pstack::Procman::AddressRange::Permission>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<char,_std::pair<const_char,_pstack::Procman::AddressRange::Permission>,_std::allocator<std::pair<const_char,_pstack::Procman::AddressRange::Permission>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&procAddressSpace::flagmap,(key_type *)auStack_228);
        std::
        _Rb_tree<pstack::Procman::AddressRange::Permission,pstack::Procman::AddressRange::Permission,std::_Identity<pstack::Procman::AddressRange::Permission>,std::less<pstack::Procman::AddressRange::Permission>,std::allocator<pstack::Procman::AddressRange::Permission>>
        ::_M_insert_unique<pstack::Procman::AddressRange::Permission_const&>(local_80,__v);
      }
    }
    sVar10 = nextTok<char>((string_view *)local_48,' ');
    strv_01._M_str = sVar10._M_str;
    strv_01._M_len = (size_t)strv_01._M_str;
    uVar6 = hex2int((Procman *)sVar10._M_len,strv_01);
    pAVar1[-1].offset = uVar6;
    sVar10 = nextTok<char>((string_view *)local_48,':');
    strv_02._M_str = sVar10._M_str;
    strv_02._M_len = (size_t)strv_02._M_str;
    uVar6 = hex2int((Procman *)sVar10._M_len,strv_02);
    pAVar1[-1].backing.major = (int)uVar6;
    sVar10 = nextTok<char>((string_view *)local_48,' ');
    strv_03._M_str = sVar10._M_str;
    strv_03._M_len = (size_t)strv_03._M_str;
    uVar6 = hex2int((Procman *)sVar10._M_len,strv_03);
    pAVar1[-1].backing.minor = (int)uVar6;
    sVar10 = nextTok<char>((string_view *)local_48,' ');
    strv_04._M_str = sVar10._M_str;
    strv_04._M_len = (size_t)strv_04._M_str;
    uVar6 = hex2int((Procman *)sVar10._M_len,strv_04);
    pAVar1[-1].backing.inode = uVar6;
    __pos = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_48," ",0);
    if (__pos == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&pAVar1[-1].backing.path,"<anon>");
    }
    else {
      _auStack_228 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_48,__pos,
                                0xffffffffffffffff);
      std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)&pAVar1[-1].backing.path,(string_view *)auStack_228);
    }
    while( true ) {
      iVar4 = std::istream::peek();
      iVar4 = isupper(iVar4);
      if (iVar4 == 0) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_430,(string *)local_78);
      _c = (char *)local_78;
      auStack_228 = (undefined1  [8])buf._M_dataplus._M_p;
      sVar10 = nextTok<char>((string_view *)auStack_228,':');
      __y._M_str = "VmFlags";
      __y._M_len = 7;
      bVar3 = std::operator==(sVar10,__y);
      if (bVar3) {
        while( true ) {
          sVar10 = nextTok<char>((string_view *)auStack_228,' ');
          bVar3 = std::operator==(sVar10,(__type_identity_t<basic_string_view<char,_char_traits<char>_>_>
                                          )(ZEXT816(0x1427df) << 0x40));
          if (bVar3) break;
          sv._M_str = extraout_RDX;
          sv._M_len = (size_t)sVar10._M_str;
          buf.field_2._8_8_ = AddressRange::vmflag((AddressRange *)sVar10._M_len,sv);
          if (((ulong)buf.field_2._8_8_ >> 0x20 & 1) != 0) {
            std::
            _Rb_tree<pstack::Procman::AddressRange::VmFlag,pstack::Procman::AddressRange::VmFlag,std::_Identity<pstack::Procman::AddressRange::VmFlag>,std::less<pstack::Procman::AddressRange::VmFlag>,std::allocator<pstack::Procman::AddressRange::VmFlag>>
            ::_M_insert_unique<pstack::Procman::AddressRange::VmFlag_const&>
                      ((_Rb_tree<pstack::Procman::AddressRange::VmFlag,pstack::Procman::AddressRange::VmFlag,std::_Identity<pstack::Procman::AddressRange::VmFlag>,std::less<pstack::Procman::AddressRange::VmFlag>,std::allocator<pstack::Procman::AddressRange::VmFlag>>
                        *)&pAVar1[-1].vmflags,(VmFlag *)(buf.field_2._M_local_buf + 8));
          }
        }
      }
    }
    lVar5 = *(long *)(local_430 + -0x18);
  }
  std::ifstream::~ifstream(&local_430);
  std::__cxx11::string::~string((string *)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<AddressRange>
Process::procAddressSpace(const std::string &fn) {
    std::vector<AddressRange> rv;
    // there can be many mappings, and we don't call this very often, so
    // pre-allocate the space we need.
    rv.reserve(10240);

    std::string buf;
    buf.reserve( 1024 );
    std::ifstream input{fn};
    if ( !input.is_open() || !input.good()){
         throw ( Exception() << "unable to open smaps file: " << strerror(errno) );
    }
    while (input && input.peek() != EOF) {
       // We could just use operator>> to stream each field of the line to the
       // relevant fields, but it is ridiculously slow, I Think mostly because
       // of the use of std::hex invoking std::use_facet, which uses dynamic
       // casts. So, instead, parse out the line the hard way. This first line
       // includes details of the address range covered, and some basic
       // details. The /proc/<pid>/maps file includes just these lines.
       std::getline( input, buf );
       std::string_view remains{ buf };

       rv.emplace_back();
       AddressRange &range = rv.back();
       range.start = hex2int(nextTok( remains, '-' ));
       range.end = hex2int(nextTok( remains, ' ' ));

       std::string_view  perms = nextTok( remains, ' ' );

       static const std::unordered_map<char, AddressRange::Permission> flagmap {
           { 'r', AddressRange::Permission::read },
           { 'w', AddressRange::Permission::write },
           { 'x', AddressRange::Permission::exec },
           { 'p', AddressRange::Permission::priv },
           { 's', AddressRange::Permission::shared },
       };
       for (auto c : perms)
           if (c != '-')
               range.permissions.insert(flagmap.at(c));

       range.offset = hex2int(nextTok( remains, ' ' ));

       auto &backing = range.backing;
       backing.major = hex2int(nextTok( remains, ':' ));
       backing.minor = hex2int(nextTok( remains, ' ' ));
       backing.inode = hex2int(nextTok( remains, ' ' ));

       size_t trim = remains.find_first_not_of(" ");
       if ( trim != std::string::npos ) {
          backing.path = remains.substr( trim );
       } else {
          backing.path = "<anon>";
       }

       // Now process the attribute lines under the details of the range. These
       // are only present for /proc/<pid>/smaps.

       while (isupper(input.peek())) {
          std::getline(input, buf);
          std::string_view lineview { buf };
          auto key = nextTok( lineview, ':' );
          if (key == "VmFlags") {
             for (;;) {
                auto tok = nextTok( lineview, ' ' );
                if (tok == "")
                   break;
                auto flag = AddressRange::vmflag(tok);
                if (flag)
                   range.vmflags.insert( *flag );
             }
          }
       }
    }
    return rv;
}